

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O3

void __thiscall
glcts::TextureCubeMapArraySamplingTest::getSamplingVertexShaderCode
          (TextureCubeMapArraySamplingTest *this,samplerType *sampler_type,
          samplingFunction *sampling_function,string *out_vertex_shader_code)

{
  samplingFunction sampling_function_00;
  samplerType sVar1;
  char cVar2;
  int iVar3;
  attributeDefinition *paVar4;
  size_t sVar5;
  long *plVar6;
  GLuint n_components;
  bool bVar7;
  int iVar8;
  char *pcVar9;
  long lVar10;
  attributeDefinition *paVar11;
  bool *local_220;
  char *local_218;
  string sampling_code;
  long *local_1d8 [2];
  long local_1c8 [2];
  stringstream stream;
  undefined1 local_1a8 [376];
  
  sampling_code._M_dataplus._M_p = (pointer)&sampling_code.field_2;
  sampling_code._M_string_length = 0;
  sampling_code.field_2._M_local_buf[0] = '\0';
  std::__cxx11::stringstream::stringstream((stringstream *)&stream);
  sampling_function_00 = *sampling_function;
  n_components = 0;
  switch(sampling_function_00) {
  case Texture:
    paVar11 = getAttributes::texture_attributes;
    goto LAB_00d6ae14;
  case TextureLod:
    paVar11 = getAttributes::textureLod_attributes;
    iVar8 = 2;
    break;
  case TextureGrad:
    paVar11 = getAttributes::textureGrad_attributes;
    iVar8 = 3;
    break;
  case TextureGather:
    paVar11 = getAttributes::textureGather_attributes;
LAB_00d6ae14:
    iVar8 = 1;
    break;
  default:
    bVar7 = false;
    iVar8 = 0;
    paVar11 = (attributeDefinition *)0x0;
    goto LAB_00d6ae2c;
  }
  bVar7 = true;
LAB_00d6ae2c:
  sVar1 = *sampler_type;
  paVar4 = getAttributes::depth_attributes;
  if (sVar1 != Depth) {
    paVar4 = (attributeDefinition *)0x0;
  }
  local_218 = (GLchar *)0x0;
  local_220 = (bool *)0x0;
  pcVar9 = (char *)0x0;
  switch(sVar1) {
  case Float:
    pcVar9 = "samplerCubeArray ";
    n_components = 4;
    local_220 = fixed_sample_locations_values + 1;
    local_218 = "vec4 ";
    break;
  case Int:
    pcVar9 = "isamplerCubeArray ";
    n_components = 4;
    local_220 = (bool *)0x1b33191;
    local_218 = "ivec4 ";
    break;
  case UInt:
    pcVar9 = "usamplerCubeArray ";
    n_components = 4;
    local_220 = (bool *)0x1b33191;
    local_218 = "uvec4 ";
    break;
  case Depth:
    local_218 = "float ";
    getShadowSamplingFunctionCall
              ((TextureCubeMapArraySamplingTest *)0x1a5bd2f,sampling_function_00,"float ",1,"vs_in_"
               ,(GLchar *)0x0,"fs_in_color",(GLchar *)0x0,"sampler",&sampling_code);
    local_220 = fixed_sample_locations_values + 1;
    pcVar9 = "samplerCubeArrayShadow ";
    goto LAB_00d6af90;
  case Stencil:
    pcVar9 = "usamplerCubeArray ";
    n_components = 1;
    local_220 = (bool *)0x1b33191;
    local_218 = "uint ";
  }
  getSamplingFunctionCall
            ((TextureCubeMapArraySamplingTest *)0x1a5bd2f,sampling_function_00,local_218,
             n_components,"vs_in_",(GLchar *)0x0,"fs_in_color",(GLchar *)0x0,"sampler",
             &sampling_code);
LAB_00d6af90:
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"${VERSION}\n${TEXTURE_CUBE_MAP_ARRAY_REQUIRE}\n\n",0x2e);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"precision highp float;\n",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"/* Sampling vertex shader */",0x1c);
  cVar2 = (char)(ostream *)local_1a8;
  std::ios::widen((char)*(_func_int **)(local_1a8._0_8_ + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"uniform ",8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"highp ",6);
  iVar3 = (int)(ostream *)local_1a8;
  if (pcVar9 == (char *)0x0) {
    std::ios::clear(iVar3 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
  }
  else {
    sVar5 = strlen(pcVar9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar9,sVar5);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"sampler",7);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,";",1);
  std::ios::widen((char)*(_func_int **)(local_1a8._0_8_ + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::ios::widen((char)*(_func_int **)(local_1a8._0_8_ + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"in ",3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"vec4 ",5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"vs_in_",6);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"position",8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,";",1);
  std::ios::widen((char)*(_func_int **)(local_1a8._0_8_ + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  if (bVar7) {
    lVar10 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"in ",3);
      pcVar9 = *(char **)((long)&paVar11->type + lVar10);
      if (pcVar9 == (char *)0x0) {
        std::ios::clear(iVar3 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
      }
      else {
        sVar5 = strlen(pcVar9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar9,sVar5);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"vs_in_",6);
      pcVar9 = *(char **)((long)&paVar11->name + lVar10);
      if (pcVar9 == (char *)0x0) {
        std::ios::clear(iVar3 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
      }
      else {
        sVar5 = strlen(pcVar9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar9,sVar5);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,";",1);
      std::ios::widen((char)*(_func_int **)(local_1a8._0_8_ + -0x18) + cVar2);
      std::ostream::put(cVar2);
      std::ostream::flush();
      lVar10 = lVar10 + 0x18;
    } while ((ulong)(iVar8 + (uint)(iVar8 == 0)) * 0x18 != lVar10);
  }
  if (sVar1 == Depth) {
    bVar7 = true;
    lVar10 = 0;
    while (bVar7) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"in ",3);
      pcVar9 = paVar4[lVar10].type;
      if (pcVar9 == (char *)0x0) {
        std::ios::clear(iVar3 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
      }
      else {
        sVar5 = strlen(pcVar9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar9,sVar5);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"vs_in_",6);
      pcVar9 = paVar4[lVar10].name;
      if (pcVar9 == (char *)0x0) {
        std::ios::clear(iVar3 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
      }
      else {
        sVar5 = strlen(pcVar9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar9,sVar5);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,";",1);
      std::ios::widen((char)*(_func_int **)(local_1a8._0_8_ + -0x18) + cVar2);
      std::ostream::put(cVar2);
      lVar10 = 1;
      bVar7 = false;
      std::ostream::flush();
    }
  }
  std::ios::widen((char)*(_func_int **)(local_1a8._0_8_ + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  if (local_220 == (bool *)0x0) {
    std::ios::clear(iVar3 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
  }
  else {
    sVar5 = strlen(local_220);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,local_220,sVar5);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"out ",4);
  if (local_218 == (char *)0x0) {
    std::ios::clear(iVar3 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
  }
  else {
    sVar5 = strlen(local_218);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,local_218,sVar5);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"fs_in_color",0xb);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,";",1);
  std::ios::widen((char)*(_func_int **)(local_1a8._0_8_ + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::ios::widen((char)*(_func_int **)(local_1a8._0_8_ + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             "void main()\n{\n    gl_PointSize = 1.0f;\n    gl_Position = vs_in_position;\n",0x49);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,sampling_code._M_dataplus._M_p,sampling_code._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}",1);
  std::ios::widen((char)*(_func_int **)(local_1a8._0_8_ + -0x18) + cVar2);
  std::ostream::put(cVar2);
  plVar6 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
  std::ostream::put((char)plVar6);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)out_vertex_shader_code,(string *)local_1d8);
  if (local_1d8[0] != local_1c8) {
    operator_delete(local_1d8[0],local_1c8[0] + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sampling_code._M_dataplus._M_p != &sampling_code.field_2) {
    operator_delete(sampling_code._M_dataplus._M_p,
                    CONCAT71(sampling_code.field_2._M_allocated_capacity._1_7_,
                             sampling_code.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void TextureCubeMapArraySamplingTest::getSamplingVertexShaderCode(const samplerType&	  sampler_type,
																  const samplingFunction& sampling_function,
																  std::string&			  out_vertex_shader_code)
{
	const glw::GLchar*		   color_type					 = 0;
	const glw::GLchar*		   interpolation_type			 = 0;
	bool					   is_shadow_sampler			 = false;
	glw::GLuint				   n_components					 = 0;
	glw::GLuint				   n_routine_attributes			 = 0;
	glw::GLuint				   n_type_attributes			 = 0;
	const attributeDefinition* routine_attribute_definitions = 0;
	const attributeDefinition* type_attribute_definitions	= 0;
	const glw::GLchar*		   sampler_type_str				 = 0;
	std::string				   sampling_code;
	std::stringstream		   stream;

	/* Get attributes for sampling function */
	getAttributes(sampling_function, routine_attribute_definitions, n_routine_attributes);
	getAttributes(sampler_type, type_attribute_definitions, n_type_attributes);

	/* Get type for color variables */
	getColorType(sampler_type, color_type, interpolation_type, sampler_type_str, n_components, is_shadow_sampler);

	/* Get sampling code */
	if (false == is_shadow_sampler)
	{
		getSamplingFunctionCall(sampling_function, color_type, n_components, vertex_shader_input, 0,
								fragment_shader_input, 0, sampler_name, sampling_code);
	}
	else
	{
		getShadowSamplingFunctionCall(sampling_function, color_type, n_components, vertex_shader_input, 0,
									  fragment_shader_input, 0, sampler_name, sampling_code);
	}

	/* Preamble */
	stream << shader_code_preamble << shader_precision << "/* Sampling vertex shader */" << std::endl;

	/* uniform samplerType sampler */
	stream << shader_uniform << "highp " << sampler_type_str << sampler_name << ";" << std::endl;

	stream << std::endl;

	/* in vec4 vs_in_position */
	stream << shader_input << type_vec4 << vertex_shader_input << vertex_shader_position << ";" << std::endl;

	/* in type attribute */
	for (glw::GLuint i = 0; i < n_routine_attributes; ++i)
	{
		stream << shader_input << routine_attribute_definitions[i].type << vertex_shader_input
			   << routine_attribute_definitions[i].name << ";" << std::endl;
	}
	for (glw::GLuint i = 0; i < n_type_attributes; ++i)
	{
		stream << shader_input << type_attribute_definitions[i].type << vertex_shader_input
			   << type_attribute_definitions[i].name << ";" << std::endl;
	}

	stream << std::endl;

	/* out vec4 fs_in_color; */
	stream << interpolation_type << shader_output << color_type << fragment_shader_input << ";" << std::endl;

	stream << std::endl;

	/* Body */
	stream << vertex_shader_body_code;

	/* Sampling code */
	stream << sampling_code;

	stream << "}" << std::endl << std::endl;

	/* Store result */
	out_vertex_shader_code = stream.str();
}